

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O3

int Io_WriteMoPlaOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  DdManager *dd;
  Vec_Ptr_t *vFuncs;
  void **ppvVar4;
  void *pvVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                  ,0x188,"int Io_WriteMoPlaOne(FILE *, Abc_Ntk_t *)");
  }
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd == (DdManager *)0x0) {
    return 0;
  }
  pVVar12 = pNtk->vCos;
  uVar1 = pVVar12->nSize;
  vFuncs = (Vec_Ptr_t *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar1 - 1) {
    uVar8 = (ulong)uVar1;
  }
  vFuncs->nSize = 0;
  iVar7 = (int)uVar8;
  vFuncs->nCap = iVar7;
  uVar9 = 0;
  if (iVar7 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar7 << 3);
  }
  vFuncs->pArray = ppvVar4;
  if (0 < (int)uVar1) {
    uVar10 = 0;
    do {
      lVar13 = *(long *)(*pVVar12->pArray[uVar10] + 0x1b0);
      if (*(int *)(lVar13 + 4) < 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar3 = *(int **)(*(long *)(lVar13 + 8) + 0x38);
      pvVar5 = *(void **)(piVar3 + 2);
      if (pvVar5 == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar7 = (int)*(long *)((long)pVVar12->pArray[uVar10] + 0x10);
      lVar13 = (long)iVar7;
      iVar2 = *piVar3;
      if (iVar2 <= iVar7) {
        iVar11 = iVar7 + 10;
        if (iVar7 < iVar2 * 2) {
          iVar11 = iVar2 * 2;
        }
        if (iVar2 < iVar11) {
          pvVar5 = realloc(pvVar5,(long)iVar11 * 8);
          *(void **)(piVar3 + 2) = pvVar5;
          memset((void *)((long)*piVar3 * 8 + (long)pvVar5),0,((long)iVar11 - (long)*piVar3) * 8);
          *piVar3 = iVar11;
        }
      }
      pvVar5 = *(void **)((long)pvVar5 + lVar13 * 8);
      if (pvVar5 == (void *)0x0) {
        if (*(code **)(piVar3 + 8) == (code *)0x0) {
          pvVar5 = (void *)0x0;
        }
        else {
          uVar6 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
          *(undefined8 *)(*(long *)(piVar3 + 2) + lVar13 * 8) = uVar6;
          pvVar5 = *(void **)(*(long *)(piVar3 + 2) + lVar13 * 8);
        }
      }
      iVar7 = (int)uVar8;
      if ((int)uVar10 == iVar7) {
        if (iVar7 < 0x10) {
          if (vFuncs->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vFuncs->pArray,0x80);
          }
          vFuncs->pArray = ppvVar4;
          vFuncs->nCap = 0x10;
          uVar8 = 0x10;
        }
        else {
          uVar8 = (ulong)(uint)(iVar7 * 2);
          if (vFuncs->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar8 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(vFuncs->pArray,uVar8 * 8);
          }
          vFuncs->pArray = ppvVar4;
          vFuncs->nCap = iVar7 * 2;
        }
      }
      else {
        ppvVar4 = vFuncs->pArray;
      }
      uVar9 = uVar10 + 1;
      vFuncs->nSize = (int)uVar9;
      ppvVar4[uVar10] = pvVar5;
      pVVar12 = pNtk->vCos;
      uVar10 = uVar9;
    } while ((long)uVar9 < (long)pVVar12->nSize);
  }
  Io_WriteMoPlaOneIntMinterms(pFile,pNtk,dd,vFuncs);
  Abc_NtkFreeGlobalBdds(pNtk,0);
  ppvVar4 = vFuncs->pArray;
  if ((int)uVar9 < 1) {
    if (ppvVar4 == (void **)0x0) goto LAB_003497dc;
  }
  else {
    uVar8 = 0;
    do {
      Cudd_RecursiveDeref(dd,(DdNode *)ppvVar4[uVar8]);
      uVar8 = uVar8 + 1;
    } while ((uVar9 & 0xffffffff) != uVar8);
  }
  free(ppvVar4);
LAB_003497dc:
  free(vFuncs);
  Extra_StopManager(dd);
  return 1;
}

Assistant:

int Io_WriteMoPlaOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    int fVerbose = 0;
    DdManager * dd;
    DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
    if ( dd == NULL )
        return 0;
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

    // consider minterms
    Io_WriteMoPlaOneIntMinterms( pFile, pNtk, dd, vFuncsGlob );
    Abc_NtkFreeGlobalBdds( pNtk, 0 );

    // cleanup
    Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncsGlob );
    Extra_StopManager( dd );
    return 1;
}